

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard)

{
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  int cell;
  REF_BOOL local_ac;
  REF_INT nodes [27];
  
  ref_cell = ref_shard->grid->cell[0xb];
  local_ac = 1;
  do {
    if (local_ac == 0) {
      return 0;
    }
    local_ac = 0;
    for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
      RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
      if (RVar1 == 0) {
        uVar2 = ref_shard_pair(ref_shard,&local_ac,nodes[1],nodes[4],nodes[2],nodes[7]);
        if (uVar2 != 0) {
          uVar3 = 0xf2;
LAB_0013fa3c:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 uVar3,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
          return uVar2;
        }
        uVar2 = ref_shard_pair(ref_shard,&local_ac,nodes[5],nodes[0],nodes[6],nodes[3]);
        if (uVar2 != 0) {
          uVar3 = 0xf5;
          goto LAB_0013fa3c;
        }
        uVar2 = ref_shard_pair(ref_shard,&local_ac,nodes[1],nodes[6],nodes[0],nodes[7]);
        if (uVar2 != 0) {
          uVar3 = 0xf9;
          goto LAB_0013fa3c;
        }
        uVar2 = ref_shard_pair(ref_shard,&local_ac,nodes[5],nodes[2],nodes[4],nodes[3]);
        if (uVar2 != 0) {
          uVar3 = 0xfc;
          goto LAB_0013fa3c;
        }
        uVar2 = ref_shard_pair(ref_shard,&local_ac,nodes[0],nodes[2],nodes[4],nodes[6]);
        if (uVar2 != 0) {
          uVar3 = 0x100;
          goto LAB_0013fa3c;
        }
        uVar2 = ref_shard_pair(ref_shard,&local_ac,nodes[1],nodes[3],nodes[5],nodes[7]);
        if (uVar2 != 0) {
          uVar3 = 0x103;
          goto LAB_0013fa3c;
        }
      }
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard) {
  REF_CELL ref_cell;
  REF_BOOL again;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_hex(ref_shard_grid(ref_shard));

  again = REF_TRUE;

  while (again) {
    again = REF_FALSE;

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[4], nodes[2],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[0], nodes[6],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[6], nodes[0],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[2], nodes[4],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[0], nodes[2], nodes[4],
                         nodes[6]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[3], nodes[5],
                         nodes[7]),
          "not consist");
    }
  }

  return REF_SUCCESS;
}